

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

parse_status_t vfmatch(scanner_t *scanner,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  parse_status_t pVar7;
  parse_status_t pVar8;
  int iVar9;
  long *plVar10;
  __int32_t **pp_Var11;
  size_t sVar12;
  undefined8 *puVar13;
  int *piVar14;
  long lVar15;
  char cVar16;
  size_t sVar17;
  parse_status_t pVar18;
  uint uVar19;
  char *pcVar20;
  bool bVar21;
  token_type_t tok_type;
  token_type_t tok_type_2;
  memptr token_1;
  token_type_t tok_type_1;
  memptr token;
  memptr temp_str;
  token_type_t local_9c;
  undefined8 local_98;
  int local_8c;
  __va_list_tag *local_88;
  undefined4 *local_80;
  size_t local_78;
  memptr local_70;
  token_type_t local_5c;
  size_t local_58;
  memptr local_50;
  long local_40 [2];
  
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c0,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  local_88 = argp;
  if (fmt == (char *)0x0) {
    __assert_fail("fmt != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3c1,
                  "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
  }
  cVar16 = *fmt;
  if (cVar16 == '\0') {
    return PARSE_OK;
  }
  local_58 = scanner->cursor;
  local_8c = 1;
LAB_0010bf73:
  pcVar20 = fmt + 1;
  if (cVar16 == '\t') {
    pVar8 = scanner_get_token(scanner,&local_50,&local_9c);
    pVar18 = pVar8;
    if (local_9c != TT_WHITESPACE) {
      pVar18 = PARSE_NO_MATCH;
    }
    if (pVar8 != PARSE_OK) {
      pVar18 = pVar8;
    }
    goto LAB_0010c12f;
  }
  if (cVar16 == ' ') {
    do {
      sVar17 = scanner->cursor;
      pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
      if (pVar18 != PARSE_OK) goto LAB_0010c0bb;
      pVar18 = PARSE_OK;
      if ((token_type_t)local_98 == TT_CRLF) {
        pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
      }
    } while ((pVar18 == PARSE_OK) && ((token_type_t)local_98 == TT_WHITESPACE));
    scanner->cursor = sVar17;
LAB_0010c0bb:
    if (pVar18 == PARSE_INCOMPLETE) {
      pVar18 = (uint)(scanner->entire_msg_loaded != 0) * 3 + PARSE_INCOMPLETE;
    }
    goto LAB_0010c12f;
  }
  if (cVar16 == '%') {
    bVar1 = fmt[1];
    pcVar20 = fmt + 2;
    pVar18 = PARSE_OK;
    pVar8 = PARSE_OK;
    uVar19 = (uint)bVar1;
    if (0x62 < bVar1) {
      if (bVar1 < 0x6e) {
        if (bVar1 == 99) {
          pVar8 = scanner_get_token(scanner,&local_50,&local_9c);
          bVar21 = local_9c == TT_CRLF;
          goto LAB_0010c48c;
        }
        if (bVar1 == 100) goto switchD_0010c0fa_caseD_78;
        if (bVar1 != 0x69) goto switchD_0010bfd8_caseD_4d;
LAB_0010c37c:
        local_8c = 0;
        goto LAB_0010c12f;
      }
      switch(bVar1) {
      case 0x6e:
        local_8c = 1;
        pVar18 = pVar8;
        break;
      default:
        goto switchD_0010bfd8_caseD_4d;
      case 0x71:
        uVar19 = local_88->gp_offset;
        if ((ulong)uVar19 < 0x29) {
          puVar13 = (undefined8 *)((ulong)uVar19 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar19 + 8;
        }
        else {
          puVar13 = (undefined8 *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = puVar13 + 1;
        }
        pVar8 = scanner_get_token(scanner,(memptr *)*puVar13,&local_9c);
        bVar21 = local_9c == TT_QUOTEDSTRING;
        goto LAB_0010c48c;
      case 0x73:
        uVar19 = local_88->gp_offset;
        if ((ulong)uVar19 < 0x29) {
          puVar13 = (undefined8 *)((ulong)uVar19 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar19 + 8;
        }
        else {
          puVar13 = (undefined8 *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = puVar13 + 1;
        }
        if ((memptr *)*puVar13 == (memptr *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3d2,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        pVar8 = scanner_get_token(scanner,(memptr *)*puVar13,&local_9c);
        bVar21 = local_9c == TT_IDENTIFIER;
LAB_0010c48c:
        pVar18 = pVar8;
        if (!bVar21) {
          pVar18 = PARSE_NO_MATCH;
        }
        if (pVar8 != PARSE_OK) {
          pVar18 = pVar8;
        }
        break;
      case 0x77:
        pVar18 = scanner_get_token(scanner,&local_50,&local_9c);
        if ((pVar18 == PARSE_OK) && (local_9c != TT_WHITESPACE)) {
          scanner->cursor = scanner->cursor - local_50.length;
          pVar18 = pVar8;
        }
        break;
      case 0x78:
switchD_0010c0fa_caseD_78:
        uVar4 = local_88->gp_offset;
        if ((ulong)uVar4 < 0x29) {
          plVar10 = (long *)((ulong)uVar4 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar4 + 8;
        }
        else {
          plVar10 = (long *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = plVar10 + 1;
        }
        local_80 = (undefined4 *)*plVar10;
        if (local_80 == (undefined4 *)0x0) {
          __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",1000,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        iVar9 = 0x10;
        if (uVar19 == 100) {
          iVar9 = 10;
        }
        sVar17 = scanner->cursor;
        pVar18 = scanner_get_token(scanner,&local_70,&local_5c);
        if ((pVar18 == PARSE_OK) &&
           (pVar18 = PARSE_NO_MATCH, local_78 = sVar17, local_5c == TT_IDENTIFIER)) {
          piVar14 = __errno_location();
          *piVar14 = 0;
          lVar15 = strtol(local_70.buf,(char **)&local_98,iVar9);
          if (((-1 < lVar15) &&
              ((char *)CONCAT44(local_98._4_4_,(token_type_t)local_98) ==
               local_70.buf + local_70.length)) &&
             ((lVar15 != 0x7fffffffffffffff || (*piVar14 != 0x22)))) {
            *local_80 = (int)lVar15;
            pVar18 = pVar8;
            break;
          }
          *local_80 = (int)lVar15;
          pVar18 = PARSE_NO_MATCH;
          sVar17 = local_78;
        }
        scanner->cursor = sVar17;
      }
      goto LAB_0010c12f;
    }
    if (0x4b < bVar1) {
      if (9 < uVar19 - 0x4c) {
switchD_0010bfd8_caseD_4d:
        __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x43a,
                      "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)");
      }
      plVar10 = local_40;
      switch(uVar19) {
      case 0x4c:
        uVar19 = local_88->gp_offset;
        if ((ulong)uVar19 < 0x29) {
          plVar10 = (long *)((ulong)uVar19 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar19 + 8;
        }
        else {
          plVar10 = (long *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = plVar10 + 1;
        }
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x403,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        sVar17 = scanner->cursor;
        *plVar10 = (long)(scanner->msg->buf + sVar17);
        do {
          pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
          if (pVar18 != PARSE_OK) break;
        } while ((token_type_t)local_98 != TT_CRLF);
        if (pVar18 == PARSE_OK) {
          sVar12 = scanner->cursor - local_70.length;
          scanner->cursor = sVar12;
          plVar10[1] = sVar12 - sVar17;
        }
        break;
      default:
        goto switchD_0010bfd8_caseD_4d;
      case 0x50:
        uVar19 = local_88->gp_offset;
        if ((ulong)uVar19 < 0x29) {
          puVar13 = (undefined8 *)((ulong)uVar19 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar19 + 8;
        }
        else {
          puVar13 = (undefined8 *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = puVar13 + 1;
        }
        if ((undefined4 *)*puVar13 == (undefined4 *)0x0) {
          __assert_fail("int_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x429,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        *(undefined4 *)*puVar13 = (int)scanner->cursor;
        pVar18 = pVar8;
        break;
      case 0x52:
        uVar19 = local_88->gp_offset;
        if ((ulong)uVar19 < 0x29) {
          plVar10 = (long *)((ulong)uVar19 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar19 + 8;
        }
        else {
          plVar10 = (long *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = plVar10 + 1;
        }
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3cd,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
        sVar17 = scanner->cursor;
        *plVar10 = (long)(scanner->msg->buf + sVar17);
        plVar10[1] = 0;
        pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
        if (pVar18 == PARSE_OK) {
          bVar21 = false;
          local_80 = (undefined4 *)0x0;
          local_78 = sVar17;
          do {
            if (bVar21) {
              if ((token_type_t)local_98 != TT_WHITESPACE) {
                scanner->cursor = (size_t)local_80;
                lVar15 = plVar10[1];
                pVar18 = PARSE_OK;
                if (lVar15 == 0) goto LAB_0010c12f;
                goto LAB_0010c6e0;
              }
              bVar21 = false;
            }
            else {
              bVar21 = false;
              if ((token_type_t)local_98 == TT_CRLF) {
                local_80 = (undefined4 *)(scanner->cursor - local_70.length);
                bVar21 = true;
              }
            }
            plVar10[1] = plVar10[1] + local_70.length;
            pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
            sVar17 = local_78;
          } while (pVar18 == PARSE_OK);
        }
        scanner->cursor = sVar17;
        break;
      case 0x53:
        uVar19 = local_88->gp_offset;
        if ((ulong)uVar19 < 0x29) {
          plVar10 = (long *)((ulong)uVar19 + (long)local_88->reg_save_area);
          local_88->gp_offset = uVar19 + 8;
        }
        else {
          plVar10 = (long *)local_88->overflow_arg_area;
          local_88->overflow_arg_area = plVar10 + 1;
        }
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          __assert_fail("str_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f3,
                        "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)")
          ;
        }
      case 0x55:
        local_80 = (undefined4 *)scanner->cursor;
        plVar10[1] = 0;
        *plVar10 = (long)(scanner->msg->buf + (long)local_80);
        pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
        while ((pVar18 == PARSE_OK && ((token_type_t)local_98 - TT_CTRL < 0xfffffffe))) {
          plVar10[1] = plVar10[1] + local_70.length;
          pVar18 = scanner_get_token(scanner,&local_70,(token_type_t *)&local_98);
        }
        if (pVar18 == PARSE_INCOMPLETE) {
          if (scanner->entire_msg_loaded != 0) goto LAB_0010c5d4;
LAB_0010c5e5:
          scanner->cursor = (size_t)local_80;
        }
        else {
          if (pVar18 != PARSE_OK) goto LAB_0010c5e5;
          scanner->cursor = scanner->cursor - local_70.length;
LAB_0010c5d4:
          pVar18 = (plVar10[1] == 0) + PARSE_OK;
        }
        if ((bVar1 == 0x55) && (pVar18 == PARSE_OK)) {
          uVar19 = local_88->gp_offset;
          if ((ulong)uVar19 < 0x29) {
            puVar13 = (undefined8 *)((ulong)uVar19 + (long)local_88->reg_save_area);
            local_88->gp_offset = uVar19 + 8;
          }
          else {
            puVar13 = (undefined8 *)local_88->overflow_arg_area;
            local_88->overflow_arg_area = puVar13 + 1;
          }
          if ((uri_type *)*puVar13 == (uri_type *)0x0) {
            __assert_fail("uri_ptr != NULL",".upnp/src/genlib/net/http/httpparser.c",0x3f8,
                          "parse_status_t vfmatch(scanner_t *, const char *, struct __va_list_tag *)"
                         );
          }
          iVar9 = parse_uri((char *)*plVar10,plVar10[1],(uri_type *)*puVar13);
          bVar21 = iVar9 == 1;
LAB_0010c648:
          pVar18 = bVar21 ^ PARSE_NO_MATCH;
        }
      }
      goto LAB_0010c12f;
    }
    if ((bVar1 == 0x20) || (bVar1 == 0x25)) {
      uVar5 = scanner->cursor;
      if (scanner->msg->length <= uVar5) goto LAB_0010c73f;
      pcVar6 = scanner->msg->buf;
      scanner->cursor = uVar5 + 1;
      bVar3 = pcVar6[uVar5];
      if (local_8c == 0) {
        pp_Var11 = __ctype_tolower_loc();
        pVar18 = (*pp_Var11)[bVar1] == (*pp_Var11)[(char)bVar3] ^ PARSE_NO_MATCH;
        goto LAB_0010c37c;
      }
      bVar21 = bVar3 == bVar1;
      goto LAB_0010c648;
    }
    if (uVar19 != 0x30) goto switchD_0010bfd8_caseD_4d;
    pVar7 = PARSE_NO_MATCH;
    if ((scanner->cursor == scanner->msg->length) &&
       (pVar18 = pVar8, scanner->msg->buf[scanner->cursor] == '\0')) goto LAB_0010c12f;
  }
  else {
    uVar5 = scanner->cursor;
    if (uVar5 < scanner->msg->length) {
      pcVar6 = scanner->msg->buf;
      scanner->cursor = uVar5 + 1;
      cVar2 = pcVar6[uVar5];
      if (local_8c == 0) {
        pp_Var11 = __ctype_tolower_loc();
        local_8c = 0;
        pVar18 = (*pp_Var11)[cVar16] == (*pp_Var11)[cVar2] ^ PARSE_NO_MATCH;
      }
      else {
        pVar18 = cVar2 == cVar16 ^ PARSE_NO_MATCH;
      }
      goto LAB_0010c12f;
    }
LAB_0010c73f:
    pVar7 = PARSE_INCOMPLETE;
  }
  goto LAB_0010c744;
  while (plVar10[1] = lVar15, lVar15 != 0) {
LAB_0010c6e0:
    lVar15 = lVar15 + -1;
    if ((0x20 < (ulong)*(byte *)(*plVar10 + lVar15)) ||
       ((0x100002600U >> ((ulong)*(byte *)(*plVar10 + lVar15) & 0x3f) & 1) == 0)) break;
  }
LAB_0010c12f:
  pVar7 = pVar18;
  cVar16 = *pcVar20;
  if ((cVar16 == '\0') || (fmt = pcVar20, pVar7 != PARSE_OK)) {
    if (pVar7 == PARSE_OK) {
      return PARSE_OK;
    }
LAB_0010c744:
    scanner->cursor = local_58;
    return pVar7;
  }
  goto LAB_0010bf73;
}

Assistant:

static parse_status_t vfmatch(scanner_t *scanner, const char *fmt, va_list argp)
{
	char c;
	const char *fmt_ptr = fmt;
	parse_status_t status;
	memptr *str_ptr;
	memptr temp_str;
	int *int_ptr;
	uri_type *uri_ptr;
	size_t save_pos;
	int stat;
	int case_sensitive = 1;
	memptr token;
	token_type_t tok_type;
	int base;

	assert(scanner != NULL);
	assert(fmt != NULL);

	/* save scanner pos; to aid error recovery */
	save_pos = scanner->cursor;

	status = PARSE_OK;
	while ((c = *fmt_ptr++) && (status == (parse_status_t)PARSE_OK)) {
		if (c == '%') {
			c = *fmt_ptr++;
			switch (c) {
			case 'R': /* raw value */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = match_raw_value(scanner, str_ptr);
				break;
			case 's': /* simple identifier */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_IDENTIFIER) {
					/* not an identifier */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'c': /* crlf */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type != (token_type_t)TT_CRLF) {
					/* not CRLF token */
					status = PARSE_NO_MATCH;
				}
				break;
			case 'd': /* integer */
			case 'x': /* hex number */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				base = c == 'd' ? 10 : 16;
				status = match_int(scanner, base, int_ptr);
				break;
			case 'S': /* non-whitespace string */
			case 'U': /* uri */
				if (c == 'S') {
					str_ptr = va_arg(argp, memptr *);
				} else {
					str_ptr = &temp_str;
				}
				assert(str_ptr != NULL);
				status = match_non_ws_string(scanner, str_ptr);
				if (c == 'U' &&
					status == (parse_status_t)PARSE_OK) {
					uri_ptr = va_arg(argp, uri_type *);
					assert(uri_ptr != NULL);
					stat = parse_uri(str_ptr->buf,
						str_ptr->length,
						uri_ptr);
					if (stat != HTTP_SUCCESS) {
						status = PARSE_NO_MATCH;
					}
				}
				break;
			case 'L': /* string till eol */
				str_ptr = va_arg(argp, memptr *);
				assert(str_ptr != NULL);
				status = read_until_crlf(scanner, str_ptr);
				break;
			case ' ': /* match space */
			case '%': /* match percentage symbol */
				status = match_char(scanner, c, case_sensitive);
				break;
			case 'n': /* case-sensitive match */
				case_sensitive = 1;
				break;
			case 'i': /* ignore case */
				case_sensitive = 0;
				break;
			case 'q': /* quoted string */
				str_ptr = (memptr *)va_arg(argp, memptr *);
				status = scanner_get_token(
					scanner, str_ptr, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_QUOTEDSTRING) {
					status = PARSE_NO_MATCH; /* not a quoted
								    string */
				}
				break;
			case 'w':
				/* optional whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* restore non-whitespace token */
					scanner->cursor -= token.length;
				}
				break;
			case 'P':
				/* current pos of scanner */
				int_ptr = va_arg(argp, int *);
				assert(int_ptr != NULL);
				*int_ptr = (int)scanner->cursor;
				break;
				/* valid only in matchstr() */
			case '0':
				/* end of msg? */
				/* check that we are 1 beyond last char */
				if (scanner->cursor == scanner->msg->length &&
					scanner->msg->buf[scanner->cursor] ==
						'\0') {
					status = PARSE_OK;
				} else {
					status = PARSE_NO_MATCH;
				}
				break;
			default:
				/* unknown option */
				assert(0);
			}
		} else {
			switch (c) {
			case ' ': /* LWS* */
				status = skip_lws(scanner);
				break;
			case '\t': /* Whitespace */
				status = scanner_get_token(
					scanner, &token, &tok_type);
				if (status == (parse_status_t)PARSE_OK &&
					tok_type !=
						(token_type_t)TT_WHITESPACE) {
					/* not whitespace token */
					status = PARSE_NO_MATCH;
				}
				break;
			default: /* match characters */
			{
				status = match_char(scanner, c, case_sensitive);
			}
			}
		}
	}
	if (status != (parse_status_t)PARSE_OK) {
		/* on error, restore original scanner pos */
		scanner->cursor = save_pos;
	}

	return status;
}